

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cc
# Opt level: O0

void __thiscall wabt::sha256(wabt *this,string_view input,string *digest)

{
  uchar *puVar1;
  size_type n;
  uchar *md;
  string *digest_local;
  string_view input_local;
  
  input_local._M_len = input._M_len;
  digest_local = (string *)this;
  std::__cxx11::string::clear();
  std::__cxx11::string::resize((ulong)input._M_str);
  puVar1 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::data
                              ((basic_string_view<char,_std::char_traits<char>_> *)&digest_local);
  n = std::basic_string_view<char,_std::char_traits<char>_>::size
                ((basic_string_view<char,_std::char_traits<char>_> *)&digest_local);
  md = (uchar *)std::__cxx11::string::data();
  puVar1 = SHA256(puVar1,n,md);
  if (puVar1 == (uchar *)0x0) {
    abort();
  }
  return;
}

Assistant:

void sha256(std::string_view input, std::string& digest) {
  digest.clear();

#if HAVE_OPENSSL_SHA_H
  digest.resize(SHA256_DIGEST_LENGTH);
  if (!SHA256(reinterpret_cast<const uint8_t*>(input.data()), input.size(),
              reinterpret_cast<uint8_t*>(digest.data()))) {
    // should not be possible to fail here, but check (and abort) just in case
    abort();
  }
#else
  digest.resize(picosha2::k_digest_size);
  picosha2::hash256(input, digest);
#endif
}